

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int getEndIslands(EndIsland *islands,int mc,uint64_t seed,int chunkX,int chunkZ)

{
  int iVar1;
  uint64_t h;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  
  if (mc < 0x10) {
    return 0;
  }
  fVar16 = *(float *)(&DAT_0012dab8 + (ulong)(mc < 0x15) * 4);
  uVar15 = chunkX << 4;
  uVar7 = chunkZ << 4;
  uVar2 = getPopulationSeed(mc,seed,uVar15,uVar7);
  if (mc < 0x15) {
    uVar4 = uVar2 ^ 0x5deece66d;
    uVar13 = (uint)fVar16;
    if ((uVar13 & uVar13 - 1) == 0) {
      uVar4 = uVar4 * 0x5deece66d + 0xb & 0xffffffffffff;
      iVar1 = (int)((uVar4 >> 0x11) * (long)(int)uVar13 >> 0x1f);
    }
    else {
      do {
        uVar4 = uVar4 * 0x5deece66d + 0xb & 0xffffffffffff;
        iVar1 = (int)((long)(uVar4 >> 0x11) % (long)(int)uVar13);
      } while (-1 < (int)(iVar1 - ((int)(uVar4 >> 0x11) + uVar13)));
    }
    if (iVar1 != 0) {
      return 0;
    }
    lVar5 = uVar4 * 0x5deece66d + 0xb;
    islands->x = (uint)((ulong)lVar5 >> 0x2c) & 0xf | uVar15;
    lVar5 = lVar5 * 0x5deece66d + 0xb;
    islands->y = ((uint)((ulong)lVar5 >> 0x2c) & 0xf) + 0x37;
    lVar5 = lVar5 * 0x5deece66d + 0xb;
    islands->z = (uint)((ulong)lVar5 >> 0x2c) & 0xf | uVar7;
    uVar4 = lVar5 * 0x5deece66d + 0xb;
    if ((uVar4 & 0xc00000000000) != 0) {
      do {
        uVar4 = uVar4 * 0x5deece66d + 0xb & 0xffffffffffff;
        iVar1 = (int)(uVar4 >> 0x11);
        uVar15 = iVar1 + (int)((uVar4 >> 0x11) / 3) * -3;
      } while (-1 < (int)((uVar15 - iVar1) + -3));
      iVar1 = 1;
      lVar5 = 0xc;
      goto LAB_0010b0eb;
    }
    lVar5 = uVar4 * 0x5deece66d + 0xb;
    islands[1].x = (uint)((ulong)lVar5 >> 0x2c) & 0xf | uVar15;
    lVar5 = lVar5 * 0x5deece66d + 0xb;
    islands[1].y = ((uint)((ulong)lVar5 >> 0x2c) & 0xf) + 0x37;
    uVar4 = lVar5 * 0x5deece66d + 0xb;
    islands[1].z = (uint)(uVar4 >> 0x2c) & 0xf | uVar7;
    do {
      uVar4 = uVar4 * 0x5deece66d + 0xb & 0xffffffffffff;
      iVar1 = (int)(uVar4 >> 0x11);
      uVar7 = iVar1 + (int)((uVar4 >> 0x11) / 3) * -3;
    } while (-1 < (int)((uVar7 - iVar1) + -3));
    uVar7 = uVar7 | 4;
    fVar16 = (float)(int)uVar7;
    islands->r = uVar7;
    do {
      uVar4 = uVar4 * 0x5deece66d + 0xb;
      fVar16 = fVar16 - ((float)((uint)(uVar4 >> 0x2f) & 1) + 0.5);
    } while (0.5 < fVar16);
    do {
      uVar4 = uVar4 * 0x5deece66d + 0xb & 0xffffffffffff;
      iVar1 = (int)(uVar4 >> 0x11);
      uVar15 = iVar1 + (int)((uVar4 >> 0x11) / 3) * -3;
    } while (-1 < (int)((uVar15 - iVar1) + -3));
  }
  else if (mc == 0x15) {
    lVar5 = (uVar2 ^ 0x5deece66d) * 0x5deece66d + 0xb;
    if (fVar16 <= (float)((uint)((ulong)lVar5 >> 0x18) & 0xffffff) * 5.9604645e-08) {
      return 0;
    }
    uVar4 = lVar5 * 0x5deece66d + 0xb;
    lVar5 = uVar4 * 0x5deece66d + 0xb;
    islands->x = (uint)((ulong)lVar5 >> 0x2c) & 0xf | uVar15;
    lVar5 = lVar5 * 0x5deece66d + 0xb;
    islands->z = (uint)((ulong)lVar5 >> 0x2c) & 0xf | uVar7;
    uVar8 = lVar5 * 0x5deece66d + 0xb;
    islands->y = ((uint)(uVar8 >> 0x2c) & 0xf) + 0x37;
    do {
      uVar8 = uVar8 * 0x5deece66d + 0xb & 0xffffffffffff;
      iVar1 = (int)(uVar8 >> 0x11);
      uVar13 = iVar1 + (int)((uVar8 >> 0x11) / 3) * -3;
    } while (-1 < (int)((uVar13 - iVar1) + -3));
    uVar13 = uVar13 | 4;
    fVar16 = (float)(int)uVar13;
    islands->r = uVar13;
    do {
      uVar8 = uVar8 * 0x5deece66d + 0xb;
      fVar16 = fVar16 - ((float)((uint)(uVar8 >> 0x2f) & 1) + 0.5);
    } while (0.5 < fVar16);
    if ((uVar4 & 0xc00000000000) != 0) {
      return 1;
    }
    lVar5 = uVar8 * 0x5deece66d + 0xb;
    islands[1].x = (uint)((ulong)lVar5 >> 0x2c) & 0xf | uVar15;
    lVar5 = lVar5 * 0x5deece66d + 0xb;
    islands[1].z = (uint)((ulong)lVar5 >> 0x2c) & 0xf | uVar7;
    uVar4 = lVar5 * 0x5deece66d + 0xb;
    islands[1].y = ((uint)(uVar4 >> 0x2c) & 0xf) + 0x37;
    do {
      uVar4 = uVar4 * 0x5deece66d + 0xb & 0xffffffffffff;
      iVar1 = (int)(uVar4 >> 0x11);
      uVar15 = iVar1 + (int)((uVar4 >> 0x11) / 3) * -3;
    } while (-1 < (int)((uVar15 - iVar1) + -3));
  }
  else {
    uVar4 = uVar2 ^ 0x6a09e667f3bcc909;
    uVar8 = (uVar4 >> 0x1e ^ uVar4) * -0x40a7b892e31b1a47;
    uVar4 = (uVar4 + 0x9e3779b97f4a7c15 >> 0x1e ^ uVar4 + 0x9e3779b97f4a7c15) * -0x40a7b892e31b1a47;
    uVar8 = (uVar8 >> 0x1b ^ uVar8) * -0x6b2fb644ecceee15;
    uVar10 = (uVar4 >> 0x1b ^ uVar4) * -0x6b2fb644ecceee15;
    uVar8 = uVar8 >> 0x1f ^ uVar8;
    uVar10 = uVar10 >> 0x1f ^ uVar10;
    uVar4 = uVar10 + uVar8;
    if (fVar16 <= (float)(uint)((uVar4 * 0x20000 | uVar4 >> 0x2f) + uVar8 >> 0x28) * 5.9604645e-08)
    {
      return 0;
    }
    uVar10 = uVar10 ^ uVar8;
    uVar3 = uVar10 << 0x1c | uVar10 >> 0x24;
    uVar8 = (uVar8 << 0x31 | uVar8 >> 0xf) ^ uVar10;
    uVar6 = uVar10 << 0x15 ^ uVar8;
    uVar4 = uVar6 + uVar3;
    uVar3 = uVar3 ^ uVar6;
    uVar11 = uVar3 << 0x15 ^ (uVar8 << 0x31 | uVar6 >> 0xf) ^ uVar3;
    uVar10 = uVar3 << 0x1c | uVar3 >> 0x24;
    uVar8 = uVar11 + uVar10;
    uVar10 = uVar10 ^ uVar11;
    uVar12 = uVar10 << 0x15 ^ (uVar11 << 0x31 | uVar11 >> 0xf) ^ uVar10;
    uVar3 = uVar10 << 0x1c | uVar10 >> 0x24;
    uVar10 = uVar12 + uVar3;
    uVar3 = uVar3 ^ uVar12;
    islands->x = (uint)((uVar8 * 0x20000 | uVar8 >> 0x2f) + uVar11 >> 0x3c) | uVar15;
    uVar14 = uVar3 << 0x15 ^ (uVar12 << 0x31 | uVar12 >> 0xf) ^ uVar3;
    uVar3 = uVar3 << 0x1c | uVar3 >> 0x24;
    uVar8 = uVar14 + uVar3;
    uVar3 = uVar3 ^ uVar14;
    uVar11 = uVar3 << 0x15 ^ (uVar14 << 0x31 | uVar14 >> 0xf) ^ uVar3;
    uVar3 = uVar3 << 0x1c | uVar3 >> 0x24;
    islands->z = (uint)((uVar10 * 0x20000 | uVar10 >> 0x2f) + uVar12 >> 0x3c) | uVar7;
    islands->y = (uint)((uVar8 * 0x20000 | uVar8 >> 0x2f) + uVar14 >> 0x3c) + 0x37;
    do {
      uVar8 = ((uVar11 + uVar3) * 0x20000 | uVar11 + uVar3 >> 0x2f) + uVar11;
      uVar3 = uVar3 ^ uVar11;
      uVar11 = (uVar11 << 0x31 | uVar11 >> 0xf) ^ uVar3 << 0x15 ^ uVar3;
      uVar3 = uVar3 << 0x1c | uVar3 >> 0x24;
      uVar13 = (uint)(uVar8 >> 0x20);
      uVar9 = (uVar13 >> 1) + (int)(uVar8 / 0x600000000) * -3;
    } while (-1 < (int)((uVar9 - (uVar13 >> 1)) + -3));
    uVar9 = uVar9 | 4;
    islands->r = uVar9;
    if ((uint)((uVar4 * 0x20000 | uVar4 >> 0x2f) + uVar6 >> 0x3e) < 3) {
      return 1;
    }
    fVar16 = (float)(int)uVar9;
    do {
      lVar5 = ((uVar11 + uVar3) * 0x20000 | uVar11 + uVar3 >> 0x2f) + uVar11;
      uVar3 = uVar3 ^ uVar11;
      uVar11 = (uVar11 << 0x31 | uVar11 >> 0xf) ^ uVar3 << 0x15 ^ uVar3;
      uVar3 = uVar3 << 0x1c | uVar3 >> 0x24;
      fVar16 = fVar16 - ((float)(uint)((ulong)lVar5 >> 0x3f) + 0.5);
    } while (0.5 < fVar16);
    uVar4 = uVar3 ^ uVar11;
    uVar6 = uVar4 << 0x15 ^ (uVar11 << 0x31 | uVar11 >> 0xf) ^ uVar4;
    uVar8 = uVar4 << 0x1c | uVar4 >> 0x24;
    uVar4 = uVar6 + uVar8;
    uVar8 = uVar8 ^ uVar6;
    uVar12 = uVar8 << 0x15 ^ (uVar6 << 0x31 | uVar6 >> 0xf) ^ uVar8;
    uVar10 = uVar8 << 0x1c | uVar8 >> 0x24;
    islands[1].x = uVar15 | (uint)(((uVar11 + uVar3) * 0x20000 | uVar11 + uVar3 >> 0x2f) + uVar11 >>
                                  0x3c);
    uVar8 = uVar12 + uVar10;
    uVar10 = uVar10 ^ uVar12;
    uVar3 = uVar10 << 0x15 ^ (uVar12 << 0x31 | uVar12 >> 0xf) ^ uVar10;
    uVar10 = uVar10 << 0x1c | uVar10 >> 0x24;
    islands[1].z = uVar7 | (uint)((uVar4 * 0x20000 | uVar4 >> 0x2f) + uVar6 >> 0x3c);
    islands[1].y = (uint)((uVar8 * 0x20000 | uVar8 >> 0x2f) + uVar12 >> 0x3c) + 0x37;
    do {
      uVar4 = ((uVar3 + uVar10) * 0x20000 | uVar3 + uVar10 >> 0x2f) + uVar3;
      uVar10 = uVar10 ^ uVar3;
      uVar3 = uVar10 << 0x15 ^ (uVar3 << 0x31 | uVar3 >> 0xf) ^ uVar10;
      uVar10 = uVar10 << 0x1c | uVar10 >> 0x24;
      uVar7 = (uint)(uVar4 >> 0x21);
      uVar15 = uVar7 + (int)(uVar4 / 0x600000000) * -3;
    } while (-1 < (int)((uVar15 - uVar7) + -3));
  }
  iVar1 = 2;
  lVar5 = 0x1c;
LAB_0010b0eb:
  *(uint *)((long)&islands->x + lVar5) = uVar15 | 4;
  return iVar1;
}

Assistant:

int getEndIslands(EndIsland islands[2], int mc, uint64_t seed, int chunkX, int chunkZ)
{
    StructureConfig sconf;
    if (!getStructureConfig(End_Island, mc, &sconf))
        return 0;

    int x = chunkX * 16;
    int z = chunkZ * 16;
    uint64_t rng = getPopulationSeed(mc, seed, x, z);
    Xoroshiro xr;
    float r;

    if (mc <= MC_1_16)
    {
        setSeed(&rng, rng + sconf.salt);
        if (nextInt(&rng, (int)sconf.rarity) != 0)
            return 0;
        islands[0].x = nextInt(&rng, 16) + x;
        islands[0].y = nextInt(&rng, 16) + 55;
        islands[0].z = nextInt(&rng, 16) + z;
        if (nextInt(&rng, 4) != 0)
        {
            islands[0].r = nextInt(&rng, 3) + 4;
            return 1;
        }
        islands[1].x = nextInt(&rng, 16) + x;
        islands[1].y = nextInt(&rng, 16) + 55;
        islands[1].z = nextInt(&rng, 16) + z;
        islands[0].r = nextInt(&rng, 3) + 4;
        for (r = islands[0].r; r > 0.5; r -= nextInt(&rng, 2) + 0.5);
        islands[1].r = nextInt(&rng, 3) + 4;
        return 2;
    }
    else if (mc <= MC_1_17)
    {
        setSeed(&rng, rng + sconf.salt);
        if (nextFloat(&rng) >= sconf.rarity)
            return 0;
        int second = nextInt(&rng, 4) == 0;
        islands[0].x = nextInt(&rng, 16) + x;
        islands[0].z = nextInt(&rng, 16) + z;
        islands[0].y = nextInt(&rng, 16) + 55;
        islands[0].r = nextInt(&rng, 3) + 4;
        for (r = islands[0].r; r > 0.5; r -= nextInt(&rng, 2) + 0.5);
        if (!second)
            return 1;
        islands[1].x = nextInt(&rng, 16) + x;
        islands[1].z = nextInt(&rng, 16) + z;
        islands[1].y = nextInt(&rng, 16) + 55;
        islands[1].r = nextInt(&rng, 3) + 4;
        return 2;
    }
    else
    {
        xSetSeed(&xr, rng + sconf.salt);
        if (xNextFloat(&xr) >= sconf.rarity)
            return 0;
        int second = (xNextIntJ(&xr, 4) == 3);
        islands[0].x = xNextIntJ(&xr, 16) + x;
        islands[0].z = xNextIntJ(&xr, 16) + z;
        islands[0].y = xNextIntJ(&xr, 16) + 55;
        islands[0].r = xNextIntJ(&xr, 3) + 4;
        if (!second)
            return 1;
        for (r = islands[0].r; r > 0.5; r -= xNextIntJ(&xr, 2) + 0.5);
        islands[1].x = xNextIntJ(&xr, 16) + x;
        islands[1].z = xNextIntJ(&xr, 16) + z;
        islands[1].y = xNextIntJ(&xr, 16) + 55;
        islands[1].r = xNextIntJ(&xr, 3) + 4;
        return 2;
    }
}